

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O3

void FENToHash(char *fen,string *move_s)

{
  char fen_char;
  int iVar1;
  UINT64 UVar2;
  BookHashNode *pBVar3;
  BookHashNode *pBVar4;
  int iVar5;
  undefined8 uVar6;
  ulong uVar7;
  uint uVar8;
  undefined4 uVar9;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  Movement MVar13;
  int piece_id_array [14];
  int local_88 [14];
  string local_50;
  
  local_88[8] = 0x21;
  local_88[9] = 0x23;
  local_88[10] = 0x25;
  local_88[0xb] = 0x27;
  local_88[4] = 0x17;
  local_88[5] = 0x19;
  local_88[6] = 0x1b;
  local_88[7] = 0x20;
  local_88[0] = 0x10;
  local_88[1] = 0x11;
  local_88[2] = 0x13;
  local_88[3] = 0x15;
  local_88[0xc] = 0x29;
  local_88[0xd] = 0x2b;
  pcVar12 = fen + 1;
  iVar10 = 3;
  uVar11 = 3;
  do {
    fen_char = pcVar12[-1];
    if (fen_char == '/') {
      iVar10 = iVar10 + 1;
      uVar11 = 3;
    }
    else {
      if (fen_char == ' ') break;
      if ((byte)(fen_char - 0x31U) < 9) {
        uVar11 = uVar11 + (byte)(fen_char - 0x30);
      }
      else {
        iVar5 = PieceOfFen(fen_char);
        iVar1 = local_88[iVar5];
        uVar8 = iVar10 << 4 | uVar11;
        BookZobristKey = BookZobristKey ^ ZobristTable[iVar1][(int)uVar8];
        BookZobristKeyCheck = BookZobristKeyCheck ^ ZobristTableCheck[iVar1][(int)uVar8];
        local_88[iVar5] = iVar1 + 1;
        uVar11 = uVar11 + 1;
      }
    }
    pcVar12 = pcVar12 + 1;
  } while( true );
  uVar7 = BookZobristKey;
  if (*pcVar12 == 'w') {
    uVar7 = BookZobristKey ^ ZobristPlayer;
    BookZobristKeyCheck = BookZobristKeyCheck ^ ZobristPlayerCheck;
    BookZobristKey = uVar7;
  }
  do {
    uVar11 = (uint)uVar7 & 0xfffff;
    UVar2 = BookHashTable[uVar11].check;
    if (UVar2 == 0) break;
    uVar7 = (ulong)(uVar11 + 1);
  } while (UVar2 != BookZobristKeyCheck);
  if (UVar2 == 0) {
    BookHashTable[uVar11].check = BookZobristKeyCheck;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)move_s);
    MVar13 = StrToMovement(&local_50);
    pBVar4 = BookHashTable;
    uVar9 = MVar13._8_4_;
    uVar6 = MVar13._0_8_;
    pBVar3 = BookHashTable + uVar11;
    (pBVar3->move).from = (char)uVar6;
    (pBVar3->move).to = (char)((ulong)uVar6 >> 8);
    (pBVar3->move).capture = (char)((ulong)uVar6 >> 0x10);
    (pBVar3->move).field_0x3 = (char)((ulong)uVar6 >> 0x18);
    (pBVar3->move).value = (int)((ulong)uVar6 >> 0x20);
    pBVar4 = pBVar4 + uVar11;
    (pBVar4->move).catc = (char)uVar9;
    (pBVar4->move).movec = (char)((uint)uVar9 >> 8);
    *(short *)&(pBVar4->move).field_0xa = (short)((uint)uVar9 >> 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void FENToHash(const char* fen, string move_s){
    const char *p = fen;
    int piece_id_array[14] = {16, 17, 19, 21, 23, 25, 27, 32, 33, 35, 37, 39, 41, 43};
    int col = GetCol(BOARD_FIRST_POSITION), row = GetRow(BOARD_FIRST_POSITION), piece_id_index, piece_id;

    while(*p != ' '){
        if(*p == '/'){
            col = 3;
            row ++;
        }
        else if(*p > '0' && *p <= '9'){
            int no_piece = *p - '0';
            col += no_piece;
        }
        else{
            piece_id_index = PieceOfFen(*p);
            piece_id = piece_id_array[piece_id_index];
            BookZobristKey ^= ZobristTable[piece_id][GetPosition(col, row)];
            BookZobristKeyCheck ^= ZobristTableCheck[piece_id][GetPosition(col, row)];

            piece_id_array[piece_id_index] ++;
            col ++;
        }
        p ++;
    }
    p ++;   // *p = side
    if(*p == 'w'){
        BookZobristKey ^= ZobristPlayer;
        BookZobristKeyCheck ^= ZobristPlayerCheck;
    }

    UINT32 place;
    place = BookZobristKey & BOOK_HASHTABLE_MASK;
    while(BookHashTable[place].check && BookHashTable[place].check != BookZobristKeyCheck)  // 存着不同的局面，遇到冲突，线性探测再散列
        place = (place + 1) & BOOK_HASHTABLE_MASK;

    if(!BookHashTable[place].check){                            // 位置为空，存入哈希表
        BookHashTable[place].check = BookZobristKeyCheck;
        BookHashTable[place].move = StrToMovement(move_s.substr(0, 4));
    }
}